

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O3

void __thiscall MemMap::MemMap(MemMap *this,string *fname)

{
  pointer pcVar1;
  int __fd;
  size_t __len;
  uint8_t *puVar2;
  runtime_error *prVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->fname)._M_dataplus._M_p = (pointer)&(this->fname).field_2;
  pcVar1 = (fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fname,pcVar1,pcVar1 + fname->_M_string_length);
  __fd = open((fname->_M_dataplus)._M_p,0,0x180);
  this->fd = __fd;
  if (__fd == -1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"file open error","");
    std::runtime_error::runtime_error(prVar3,(string *)local_50);
    *(undefined ***)prVar3 = &PTR__file_open_error_0025eba8;
    *(runtime_error **)(prVar3 + 0x10) = prVar3 + 0x20;
    *(undefined8 *)(prVar3 + 0x18) = 0;
    prVar3[0x20] = (runtime_error)0x0;
    __cxa_throw(prVar3,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  __len = lseek(__fd,0,2);
  if (__len == 0xffffffffffffffff) {
    close(this->fd);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"lseek failed","");
    std::runtime_error::runtime_error(prVar3,(string *)local_50);
    *(undefined ***)prVar3 = &PTR__file_open_error_0025eba8;
    *(runtime_error **)(prVar3 + 0x10) = prVar3 + 0x20;
    *(undefined8 *)(prVar3 + 0x18) = 0;
    prVar3[0x20] = (runtime_error)0x0;
    __cxa_throw(prVar3,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  if (__len == 0) {
    close(this->fd);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::runtime_error::runtime_error(prVar3,(string *)fname);
    *(undefined ***)prVar3 = &PTR__empty_file_error_0025eb68;
    *(runtime_error **)(prVar3 + 0x10) = prVar3 + 0x20;
    *(undefined8 *)(prVar3 + 0x18) = 0;
    prVar3[0x20] = (runtime_error)0x0;
    __cxa_throw(prVar3,&empty_file_error::typeinfo,empty_file_error::~empty_file_error);
  }
  this->fsize = __len;
  puVar2 = (uint8_t *)mmap((void *)0x0,__len,1,1,this->fd,0);
  this->mmap_ptr = puVar2;
  if (puVar2 != (uint8_t *)0xffffffffffffffff) {
    return;
  }
  close(this->fd);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"mmap failed","");
  std::runtime_error::runtime_error(prVar3,(string *)local_50);
  *(undefined ***)prVar3 = &PTR__file_open_error_0025eba8;
  *(runtime_error **)(prVar3 + 0x10) = prVar3 + 0x20;
  *(undefined8 *)(prVar3 + 0x18) = 0;
  prVar3[0x20] = (runtime_error)0x0;
  __cxa_throw(prVar3,&file_open_error::typeinfo,file_open_error::~file_open_error);
}

Assistant:

MemMap::MemMap(const std::string &fname) : fname(fname) {
    fd = open(fname.c_str(), O_RDONLY, static_cast<mode_t>(0600));

    if (fd == -1) {
        throw file_open_error("file open error");
    }

    off_t fsize_tmp = lseek(fd, 0, SEEK_END);

    if (fsize_tmp == 0) {
        close(fd);
        throw empty_file_error(fname);
    }

    if (fsize_tmp == -1) {
        close(fd);
        throw file_open_error("lseek failed");
    }

    fsize = static_cast<uint64_t>(fsize_tmp);
    mmap_ptr = static_cast<uint8_t *>(
        mmap(nullptr, fsize, PROT_READ, MAP_SHARED, fd, 0));

    if (mmap_ptr == MAP_FAILED) {
        close(fd);
        throw file_open_error("mmap failed");
    }
}